

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

void __thiscall glslang::TSymbol::dumpExtensions(TSymbol *this,TInfoSink *infoSink)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  TInfoSinkBase *this_00;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (*this->_vptr_TSymbol[0x11])();
  if (uVar1 == 0) {
    return;
  }
  this_00 = &infoSink->debug;
  TInfoSinkBase::append(this_00," <");
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar2 = (*this->_vptr_TSymbol[0x12])(this);
    TInfoSinkBase::append(this_00,*(char **)(CONCAT44(extraout_var,iVar2) + uVar3 * 8));
    TInfoSinkBase::append(this_00,",");
  }
  TInfoSinkBase::append(this_00,">");
  return;
}

Assistant:

void TSymbol::dumpExtensions(TInfoSink& infoSink) const
{
    int numExtensions = getNumExtensions();
    if (numExtensions) {
        infoSink.debug << " <";

        for (int i = 0; i < numExtensions; i++)
            infoSink.debug << getExtensions()[i] << ",";

        infoSink.debug << ">";
    }
}